

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pic_test(stbi__context *s)

{
  int iVar1;
  stbi__context *in_RDI;
  int r;
  stbi__context *in_stack_ffffffffffffffe8;
  
  iVar1 = stbi__pic_test_core(in_stack_ffffffffffffffe8);
  stbi__rewind(in_RDI);
  return iVar1;
}

Assistant:

static int stbi__pic_test(stbi__context *s)
{
   int r = stbi__pic_test_core(s);
   stbi__rewind(s);
   return r;
}